

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

void genxDispose(genxWriter w)

{
  long in_RDI;
  utf8 *pp;
  genxAttribute_conflict *aa;
  genxElement *ee;
  genxNamespace *nn;
  int i;
  void *in_stack_ffffffffffffffc8;
  genxWriter w_00;
  undefined4 local_c;
  
  w_00 = *(genxWriter *)(in_RDI + 0x100a0);
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x10050); local_c = local_c + 1) {
    deallocate(w_00,in_stack_ffffffffffffffc8);
    deallocate(w_00,in_stack_ffffffffffffffc8);
  }
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x10068); local_c = local_c + 1) {
    deallocate(w_00,in_stack_ffffffffffffffc8);
    deallocate(w_00,in_stack_ffffffffffffffc8);
  }
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x10080); local_c = local_c + 1) {
    deallocate(w_00,in_stack_ffffffffffffffc8);
    deallocate(w_00,in_stack_ffffffffffffffc8);
    deallocate(w_00,in_stack_ffffffffffffffc8);
  }
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x10098); local_c = local_c + 1) {
    deallocate(w_00,in_stack_ffffffffffffffc8);
  }
  deallocate(w_00,in_stack_ffffffffffffffc8);
  deallocate(w_00,in_stack_ffffffffffffffc8);
  deallocate(w_00,in_stack_ffffffffffffffc8);
  deallocate(w_00,in_stack_ffffffffffffffc8);
  deallocate(w_00,in_stack_ffffffffffffffc8);
  deallocate(w_00,in_stack_ffffffffffffffc8);
  deallocate(w_00,in_stack_ffffffffffffffc8);
  deallocate(w_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void genxDispose(genxWriter w)
{
  int i;
  genxNamespace * nn = (genxNamespace *) w->namespaces.pointers;
  genxElement * ee = (genxElement *) w->elements.pointers;
  genxAttribute * aa = (genxAttribute *) w->attributes.pointers;
  utf8 * pp = (utf8 *) w->prefixes.pointers;

  for (i = 0; i < w->namespaces.count; i++)
  {
    deallocate(w, nn[i]->name);
    deallocate(w, nn[i]);
  }

  for (i = 0; i < w->elements.count; i++)
  {
    deallocate(w, ee[i]->type);
    deallocate(w, ee[i]);
  }

  for (i = 0; i < w->attributes.count; i++)
  {
    deallocate(w, aa[i]->name);
    deallocate(w, aa[i]->value.buf);
    deallocate(w, aa[i]);
  }

  for(i = 0; i < w->prefixes.count; i++)
    deallocate(w, pp[i]);

  deallocate(w, w->namespaces.pointers);
  deallocate(w, w->elements.pointers);
  deallocate(w, w->attributes.pointers);
  deallocate(w, w->prefixes.pointers);
  deallocate(w, w->stack.pointers);

  deallocate(w, w->arec.value.buf);

  deallocate(w, w->empty);

  /* how Oscar dealt with Igli */
  deallocate(w, w);
}